

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_OptimizedTree.cpp
# Opt level: O1

bool __thiscall Opcode::AABBNoLeafTree::Build(AABBNoLeafTree *this,AABBTree *tree)

{
  undefined8 *puVar1;
  AABBNoLeafNode *pAVar2;
  ulong *puVar3;
  udword uVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  udword CurID;
  udword local_1c;
  
  if (tree != (AABBTree *)0x0) {
    uVar4 = (tree->super_AABBTreeNode).mNbPrimitives;
    bVar7 = tree->mTotalNbNodes == uVar4 * 2 - 1;
    if (bVar7) {
      uVar4 = uVar4 - 1;
      if ((this->super_AABBOptimizedTree).mNbNodes != uVar4) {
        (this->super_AABBOptimizedTree).mNbNodes = uVar4;
        pAVar2 = this->mNodes;
        if (pAVar2 != (AABBNoLeafNode *)0x0) {
          operator_delete__(&pAVar2[-1].mNegData,pAVar2[-1].mNegData * 0x28 + 8);
          this->mNodes = (AABBNoLeafNode *)0x0;
        }
        uVar6 = (ulong)(this->super_AABBOptimizedTree).mNbNodes;
        puVar3 = (ulong *)operator_new__(uVar6 * 0x28 + 8);
        *puVar3 = uVar6;
        if (uVar6 != 0) {
          lVar5 = 0;
          do {
            puVar1 = (undefined8 *)((long)puVar3 + lVar5 + 0x20);
            *puVar1 = 0;
            puVar1[1] = 0;
            lVar5 = lVar5 + 0x28;
          } while (uVar6 * 0x28 != lVar5);
        }
        this->mNodes = (AABBNoLeafNode *)(puVar3 + 1);
      }
      local_1c = 1;
      _BuildNoLeafTree(this->mNodes,0,&local_1c,&tree->super_AABBTreeNode);
      bVar7 = true;
    }
    return bVar7;
  }
  return false;
}

Assistant:

bool AABBNoLeafTree::Build(AABBTree* tree)
{
	// Checkings
	if(!tree)	return false;
	// Check the input tree is complete
	udword NbTriangles	= tree->GetNbPrimitives();
	udword NbNodes		= tree->GetNbNodes();
	if(NbNodes!=NbTriangles*2-1)	return false;

	// Get nodes
	if(mNbNodes!=NbTriangles-1)	// Same number of nodes => keep moving
	{
		mNbNodes = NbTriangles-1;
		DELETEARRAY(mNodes);
		mNodes = new AABBNoLeafNode[mNbNodes];
		CHECKALLOC(mNodes);
	}

	// Build the tree
	udword CurID = 1;
	_BuildNoLeafTree(mNodes, 0, CurID, tree);
	ASSERT(CurID==mNbNodes);

	return true;
}